

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

size_t local_cid_size(quicly_conn_t *conn)

{
  uint64_t capacity;
  quicly_conn_t *conn_local;
  size_t local_8;
  
  if (((conn->super).ctx)->cid_encryptor == (quicly_cid_encryptor_t *)0x0) {
    local_8 = 1;
  }
  else {
    capacity = (conn->super).remote.transport_params.active_connection_id_limit;
    if (4 < capacity) {
      capacity = 4;
    }
    local_8 = capacity;
  }
  return local_8;
}

Assistant:

static size_t local_cid_size(const quicly_conn_t *conn)
{
    PTLS_BUILD_ASSERT(QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT < SIZE_MAX / sizeof(uint64_t));

    /* if we don't have an encryptor, the only CID we issue is the one we send during handshake */
    if (conn->super.ctx->cid_encryptor == NULL)
        return 1;

    uint64_t capacity = conn->super.remote.transport_params.active_connection_id_limit;
    if (capacity > QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT)
        capacity = QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT;
    return capacity;
}